

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_exit_example.cpp
# Opt level: O0

void foo3(int *a)

{
  ostream *poVar1;
  undefined1 local_28 [8];
  saver_exit<int> state_saver;
  int *a_local;
  
  state_saver.super_state_saver<int,_nstd::detail::on_exit_policy>._16_8_ = a;
  nstd::saver_exit<int>::state_saver((saver_exit<int> *)local_28,a);
  *(undefined4 *)state_saver.super_state_saver<int,_nstd::detail::on_exit_policy>._16_8_ = 3;
  poVar1 = std::operator<<((ostream *)&std::cout,"foo3 a = ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(int *)state_saver.
                                     super_state_saver<int,_nstd::detail::on_exit_policy>._16_8_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  nstd::saver_exit<int>::~saver_exit((saver_exit<int> *)local_28);
  return;
}

Assistant:

void foo3(int& a) {
#if defined(__cpp_deduction_guides) && __cpp_deduction_guides >= 201611L
  nstd::saver_exit state_saver{a}; // Custom state saver on exit, without macros.
#else
  nstd::saver_exit<decltype(a)> state_saver{a}; // Custom state saver on exit, without macros.
#endif
  a = 3;
  std::cout << "foo3 a = " << a << std::endl;
  // Original state will automatically restored, on scope leave.
}